

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

float __thiscall
ImGuiMenuColumns::DeclColumns
          (ImGuiMenuColumns *this,float w_icon,float w_label,float w_shortcut,float w_mark)

{
  unsigned_short uVar1;
  uint uVar2;
  ImGuiMenuColumns *in_RDI;
  float in_XMM0_Da;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  
  uVar1 = ImMax<unsigned_short>(in_RDI->Widths[0],(unsigned_short)(int)in_XMM0_Da);
  in_RDI->Widths[0] = uVar1;
  uVar1 = ImMax<unsigned_short>(in_RDI->Widths[1],(unsigned_short)(int)in_XMM1_Da);
  in_RDI->Widths[1] = uVar1;
  uVar1 = ImMax<unsigned_short>(in_RDI->Widths[2],(unsigned_short)(int)in_XMM2_Da);
  in_RDI->Widths[2] = uVar1;
  uVar1 = ImMax<unsigned_short>(in_RDI->Widths[3],(unsigned_short)(int)in_XMM3_Da);
  in_RDI->Widths[3] = uVar1;
  CalcNextTotalWidth(in_RDI,false);
  uVar2 = ImMax<unsigned_int>(in_RDI->TotalWidth,in_RDI->NextTotalWidth);
  return (float)uVar2;
}

Assistant:

float ImGuiMenuColumns::DeclColumns(float w_icon, float w_label, float w_shortcut, float w_mark)
{
    Widths[0] = ImMax(Widths[0], (ImU16)w_icon);
    Widths[1] = ImMax(Widths[1], (ImU16)w_label);
    Widths[2] = ImMax(Widths[2], (ImU16)w_shortcut);
    Widths[3] = ImMax(Widths[3], (ImU16)w_mark);
    CalcNextTotalWidth(false);
    return (float)ImMax(TotalWidth, NextTotalWidth);
}